

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simUtils.c
# Opt level: O2

int Sim_UtilInfoIsImp(uint *pPats1,uint *pPats2,int nSimWords)

{
  uint *puVar1;
  uint *puVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar3 = 0;
  uVar4 = (ulong)(uint)nSimWords;
  if (nSimWords < 1) {
    uVar4 = uVar3;
  }
  do {
    if (uVar4 == uVar3) {
      return 1;
    }
    puVar1 = pPats2 + uVar3;
    puVar2 = pPats1 + uVar3;
    uVar3 = uVar3 + 1;
  } while ((*puVar2 & ~*puVar1) == 0);
  return 0;
}

Assistant:

int Sim_UtilInfoIsImp( unsigned * pPats1, unsigned * pPats2, int nSimWords )
{
    int k;
    for ( k = 0; k < nSimWords; k++ )
        if ( pPats1[k] & ~pPats2[k] )
            return 0;
    return 1;
}